

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O0

bool __thiscall
timertt::details::
timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
::
activate<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
          (timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>
           *this,timer_object_holder<timertt::thread_safety::unsafe> *timer,
          duration<long,_std::ratio<1L,_1000000000L>_> pause,
          duration<long,_std::ratio<1L,_1000000000L>_> period,timer_action *action)

{
  timer_kind kind;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> _Var1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  duration local_40;
  timer_type *local_38;
  timer_type *list_timer;
  timer_action *action_local;
  timer_object_holder<timertt::thread_safety::unsafe> *timer_local;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_local;
  duration<long,_std::ratio<1L,_1000000000L>_> period_local;
  duration<long,_std::ratio<1L,_1000000000L>_> pause_local;
  
  list_timer = (timer_type *)action;
  action_local = (timer_action *)timer;
  timer_local = (timer_object_holder<timertt::thread_safety::unsafe> *)this;
  this_local = (timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                *)period.__r;
  period_local = pause;
  local_38 = timer_object_holder<timertt::thread_safety::unsafe>::
             cast_to<timertt::details::timer_list_engine<timertt::thread_safety::unsafe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>::timer_type>
                       (timer);
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::ensure_timer_deactivated(local_38);
  std::function<void_()>::operator=(&local_38->m_action,action);
  local_48.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40.__r = (rep)std::chrono::operator+(&local_48,&period_local);
  (local_38->m_when).__d.__r = local_40.__r;
  _Var1 = std::chrono::
          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  (local_38->m_period).__r = _Var1.__r;
  timer_object<timertt::thread_safety::unsafe>::increment_references
            (&local_38->super_timer_object<timertt::thread_safety::unsafe>);
  *(undefined4 *)&(local_38->super_timer_object<timertt::thread_safety::unsafe>).field_0xc = 1;
  timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::insert_timer_to_list
            ((timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              *)this,local_38);
  kind = timer_list_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
         ::timer_type::kind(local_38);
  engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::inc_timer_count((engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                     *)this,kind);
  return local_38 == *(timer_type **)(this + 0x50);
}

Assistant:

bool
	activate(
		//! Timer to be activated.
		timer_object_holder< THREAD_SAFETY > timer,
		//! Pause for timer execution.
		DURATION_1 pause,
		//! Repetition period.
		//! If <tt>DURATION_2::zero() == period</tt> then timer will be
		//! single-shot.
		DURATION_2 period,
		//! Action for the timer.
		timer_action action )
	{
		auto list_timer = timer.template cast_to< timer_type >();
		ensure_timer_deactivated( list_timer );

		// Timer object must be correctly (re)initialized.
		list_timer->m_action = std::move( action );
		list_timer->m_when = monotonic_clock::now() + pause;
		list_timer->m_period = std::chrono::duration_cast<
				monotonic_clock::duration >( period );

		// Timer must be taken under control.
		timer_object< THREAD_SAFETY >::increment_references( list_timer );
		// It is an active timer now.
		list_timer->m_status = timer_status::active;

		insert_timer_to_list( list_timer );
		// Count of timers in the list changed.
		this->inc_timer_count( list_timer->kind() );

		return list_timer == m_head;
	}